

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldMessageAccessor::Swap
          (RepeatedPtrFieldMessageAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *other;
  
  if ((RepeatedFieldAccessor *)this != other_mutator) {
    Swap();
  }
  this_00 = (RepeatedPtrFieldBase *)(**(code **)((long)*this + 0x88))(this);
  other = (RepeatedPtrFieldBase *)(**(code **)((long)*this + 0x88))(this,other_data);
  if (this_00 != other) {
    if (this_00->arena_ != other->arena_) {
      RepeatedPtrFieldBase::
      SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                (this_00,other);
      return;
    }
    pvVar1 = this_00->tagged_rep_or_elem_;
    iVar4 = this_00->current_size_;
    iVar5 = this_00->capacity_proxy_;
    iVar2 = other->current_size_;
    iVar3 = other->capacity_proxy_;
    this_00->tagged_rep_or_elem_ = other->tagged_rep_or_elem_;
    this_00->current_size_ = iVar2;
    this_00->capacity_proxy_ = iVar3;
    other->tagged_rep_or_elem_ = pvVar1;
    other->current_size_ = iVar4;
    other->capacity_proxy_ = iVar5;
  }
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    ABSL_CHECK_EQ(this, other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }